

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

QString * absoluteFilePath(QString *__return_storage_ptr__,Options *options,
                          QString *relativeFileName)

{
  pointer pQVar1;
  Data *pDVar2;
  char cVar3;
  QString *dir;
  QString *pQVar4;
  QString *prefix;
  long in_FS_OFFSET;
  QLatin1String QVar5;
  QLatin1String QVar6;
  QLatin1String QVar7;
  QLatin1String QVar8;
  QArrayData *local_88;
  char16_t *pcStack_80;
  QArrayData *local_78;
  undefined1 local_70 [32];
  QArrayData *local_50;
  char16_t *pcStack_48;
  QArrayData *local_40;
  QString *local_38;
  
  local_38 = *(QString **)(in_FS_OFFSET + 0x28);
  QVar5.m_data = &DAT_00000004;
  QVar5.m_size = (qsizetype)relativeFileName;
  cVar3 = QString::startsWith(QVar5,0x145d9a);
  if (cVar3 != '\0') {
    pQVar4 = (options->extraLibraryDirs).super__Vector_base<QString,_std::allocator<QString>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pQVar1 = (options->extraLibraryDirs).super__Vector_base<QString,_std::allocator<QString>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if (pQVar4 != pQVar1) {
      do {
        (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        (__return_storage_ptr__->d).ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
        QString::mid((longlong)&local_88,(longlong)relativeFileName);
        local_50 = local_78;
        local_70._24_8_ = pcStack_80;
        local_70._16_8_ = local_88;
        local_70._8_2_ = L'/';
        local_88 = (QArrayData *)0x0;
        pcStack_80 = (char16_t *)0x0;
        local_78 = (QArrayData *)0x0;
        local_70._0_8_ = pQVar4;
        QStringBuilder<QStringBuilder<const_QString_&,_char16_t>,_QString>::convertTo<QString>
                  (__return_storage_ptr__,
                   (QStringBuilder<QStringBuilder<const_QString_&,_char16_t>,_QString> *)local_70);
        if ((QArrayData *)local_70._16_8_ != (QArrayData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)local_70._16_8_)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)local_70._16_8_)->_q_value).super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)local_70._16_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate((QArrayData *)local_70._16_8_,2,0x10);
          }
        }
        if (local_88 != (QArrayData *)0x0) {
          LOCK();
          (local_88->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_88->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_88->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_88,2,0x10);
          }
        }
        cVar3 = QFile::exists((QString *)__return_storage_ptr__);
        if (cVar3 != '\0') goto LAB_0011d5e2;
        pDVar2 = (__return_storage_ptr__->d).d;
        if (pDVar2 != (Data *)0x0) {
          LOCK();
          (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&((__return_storage_ptr__->d).d)->super_QArrayData,2,0x10);
          }
        }
        pQVar4 = pQVar4 + 1;
      } while (pQVar4 != pQVar1);
    }
  }
  pQVar4 = (options->extraPrefixDirs).super__Vector_base<QString,_std::allocator<QString>_>._M_impl.
           super__Vector_impl_data._M_start;
  pQVar1 = (options->extraPrefixDirs).super__Vector_base<QString,_std::allocator<QString>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pQVar4 != pQVar1) {
    do {
      (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      (__return_storage_ptr__->d).ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      local_70._8_2_ = L'/';
      local_70._0_8_ = pQVar4;
      local_70._16_8_ = relativeFileName;
      QStringBuilder<QStringBuilder<const_QString_&,_char16_t>,_const_QString_&>::convertTo<QString>
                (__return_storage_ptr__,
                 (QStringBuilder<QStringBuilder<const_QString_&,_char16_t>,_const_QString_&> *)
                 local_70);
      cVar3 = QFile::exists((QString *)__return_storage_ptr__);
      if (cVar3 != '\0') goto LAB_0011d5e2;
      pDVar2 = (__return_storage_ptr__->d).d;
      if (pDVar2 != (Data *)0x0) {
        LOCK();
        (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&((__return_storage_ptr__->d).d)->super_QArrayData,2,0x10);
        }
      }
      pQVar4 = pQVar4 + 1;
    } while (pQVar4 != pQVar1);
  }
  QVar6.m_data = (char *)0x19;
  QVar6.m_size = (qsizetype)relativeFileName;
  cVar3 = QString::endsWith(QVar6,0x145cb7);
  if (cVar3 == '\0') {
    QVar7.m_data = &DAT_00000004;
    QVar7.m_size = (qsizetype)relativeFileName;
    cVar3 = QString::startsWith(QVar7,0x1464c8);
    if (cVar3 == '\0') {
      QVar8.m_data = &DAT_00000004;
      QVar8.m_size = (qsizetype)relativeFileName;
      cVar3 = QString::startsWith(QVar8,0x145d9a);
      if (cVar3 == '\0') {
        local_70._8_2_ = L'/';
        local_70._0_8_ = &options->qtInstallDirectory;
        local_70._16_8_ = relativeFileName;
        QStringBuilder<QStringBuilder<const_QString_&,_char16_t>,_const_QString_&>::
        convertTo<QString>(__return_storage_ptr__,
                           (QStringBuilder<QStringBuilder<const_QString_&,_char16_t>,_const_QString_&>
                            *)local_70);
      }
      else {
        QString::mid((longlong)&local_88,(longlong)relativeFileName);
        local_40 = local_78;
        pcStack_48 = pcStack_80;
        local_50 = local_88;
        local_70._8_2_ = L'/';
        local_70._24_2_ = 0x2f;
        local_88 = (QArrayData *)0x0;
        pcStack_80 = (char16_t *)0x0;
        local_78 = (QArrayData *)0x0;
        local_70._0_8_ = &options->qtInstallDirectory;
        local_70._16_8_ = &options->qtLibsDirectory;
        QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_QString_&,_char16_t>,_const_QString_&>,_char16_t>,_QString>
        ::convertTo<QString>
                  (__return_storage_ptr__,
                   (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_QString_&,_char16_t>,_const_QString_&>,_char16_t>,_QString>
                    *)local_70);
        if (local_50 != (QArrayData *)0x0) {
          LOCK();
          (local_50->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_50->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_50->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_50,2,0x10);
          }
        }
        if (local_88 != (QArrayData *)0x0) {
          LOCK();
          (local_88->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_88->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_88->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_88,2,0x10);
          }
        }
      }
      goto LAB_0011d5e2;
    }
    local_70._16_8_ = &options->qtDataDirectory;
  }
  else {
    pQVar4 = (options->extraLibraryDirs).super__Vector_base<QString,_std::allocator<QString>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pQVar1 = (options->extraLibraryDirs).super__Vector_base<QString,_std::allocator<QString>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if (pQVar4 != pQVar1) {
      do {
        (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        (__return_storage_ptr__->d).ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
        local_70._8_2_ = L'/';
        local_70._0_8_ = pQVar4;
        local_70._16_8_ = relativeFileName;
        QStringBuilder<QStringBuilder<const_QString_&,_char16_t>,_const_QString_&>::
        convertTo<QString>(__return_storage_ptr__,
                           (QStringBuilder<QStringBuilder<const_QString_&,_char16_t>,_const_QString_&>
                            *)local_70);
        cVar3 = QFile::exists((QString *)__return_storage_ptr__);
        if (cVar3 != '\0') goto LAB_0011d5e2;
        pDVar2 = (__return_storage_ptr__->d).d;
        if (pDVar2 != (Data *)0x0) {
          LOCK();
          (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&((__return_storage_ptr__->d).d)->super_QArrayData,2,0x10);
          }
        }
        pQVar4 = pQVar4 + 1;
      } while (pQVar4 != pQVar1);
    }
    local_70._16_8_ = &options->qtLibsDirectory;
  }
  local_70._0_8_ = &options->qtInstallDirectory;
  local_70._8_2_ = L'/';
  local_70._24_2_ = 0x2f;
  local_50 = (QArrayData *)relativeFileName;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_QString_&,_char16_t>,_const_QString_&>,_char16_t>,_const_QString_&>
  ::convertTo<QString>
            (__return_storage_ptr__,
             (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_QString_&,_char16_t>,_const_QString_&>,_char16_t>,_const_QString_&>
              *)local_70);
LAB_0011d5e2:
  if (*(QString **)(in_FS_OFFSET + 0x28) == local_38) {
    return *(QString **)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

static QString absoluteFilePath(const Options *options, const QString &relativeFileName)
{
    // Use extraLibraryDirs as the extra library lookup folder if it is expected to find a file in
    // any $prefix/lib folder.
    // Library directories from a build tree(extraLibraryDirs) have the higher priority.
    if (relativeFileName.startsWith("lib/"_L1)) {
        for (const auto &dir : options->extraLibraryDirs) {
            const QString path = dir + u'/' + relativeFileName.mid(sizeof("lib/") - 1);
            if (QFile::exists(path))
                return path;
        }
    }

    for (const auto &prefix : options->extraPrefixDirs) {
        const QString path = prefix + u'/' + relativeFileName;
        if (QFile::exists(path))
            return path;
    }

    if (relativeFileName.endsWith("-android-dependencies.xml"_L1)) {
        for (const auto &dir : options->extraLibraryDirs) {
            const QString path = dir + u'/' + relativeFileName;
            if (QFile::exists(path))
                return path;
        }
        return options->qtInstallDirectory + u'/' + options->qtLibsDirectory +
               u'/' + relativeFileName;
    }

    if (relativeFileName.startsWith("jar/"_L1)) {
        return options->qtInstallDirectory + u'/' + options->qtDataDirectory +
               u'/' + relativeFileName;
    }

    if (relativeFileName.startsWith("lib/"_L1)) {
        return options->qtInstallDirectory + u'/' + options->qtLibsDirectory +
               u'/' + relativeFileName.mid(sizeof("lib/") - 1);
    }
    return options->qtInstallDirectory + u'/' + relativeFileName;
}